

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O1

void __thiscall HTTPWorkItem::~HTTPWorkItem(HTTPWorkItem *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  _Manager_type p_Var3;
  pointer pcVar4;
  HTTPRequest *this_00;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var3 = (this->func).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->func,(_Any_data *)&this->func,__destroy_functor);
  }
  pcVar4 = (this->path)._M_dataplus._M_p;
  paVar1 = &(this->path).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  this_00 = (this->req)._M_t.super___uniq_ptr_impl<HTTPRequest,_std::default_delete<HTTPRequest>_>.
            _M_t.super__Tuple_impl<0UL,_HTTPRequest_*,_std::default_delete<HTTPRequest>_>.
            super__Head_base<0UL,_HTTPRequest_*,_false>._M_head_impl;
  if (this_00 != (HTTPRequest *)0x0) {
    HTTPRequest::~HTTPRequest(this_00);
    operator_delete(this_00,0x18);
  }
  (this->req)._M_t.super___uniq_ptr_impl<HTTPRequest,_std::default_delete<HTTPRequest>_>._M_t.
  super__Tuple_impl<0UL,_HTTPRequest_*,_std::default_delete<HTTPRequest>_>.
  super__Head_base<0UL,_HTTPRequest_*,_false>._M_head_impl = (HTTPRequest *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    operator_delete(this,0x50);
    return;
  }
  __stack_chk_fail();
}

Assistant:

HTTPWorkItem(std::unique_ptr<HTTPRequest> _req, const std::string &_path, const HTTPRequestHandler& _func):
        req(std::move(_req)), path(_path), func(_func)
    {
    }